

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceUtils.cpp
# Opt level: O2

BlendEquation sglr::rr_util::mapGLBlendEquation(deUint32 equation)

{
  if (equation - 0x8006 < 6) {
    return *(BlendEquation *)(&DAT_0190539c + (ulong)(equation - 0x8006) * 4);
  }
  return BLENDEQUATION_LAST;
}

Assistant:

rr::BlendEquation mapGLBlendEquation (deUint32 equation)
{
	switch (equation)
	{
		case GL_FUNC_ADD:				return rr::BLENDEQUATION_ADD;
		case GL_FUNC_SUBTRACT:			return rr::BLENDEQUATION_SUBTRACT;
		case GL_FUNC_REVERSE_SUBTRACT:	return rr::BLENDEQUATION_REVERSE_SUBTRACT;
		case GL_MIN:					return rr::BLENDEQUATION_MIN;
		case GL_MAX:					return rr::BLENDEQUATION_MAX;
		default:
			DE_ASSERT(false);
			return rr::BLENDEQUATION_LAST;
	}
}